

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void google::protobuf::internal::PackedFieldHelper<7>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint *puVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  RepeatedField<unsigned_int> *array;
  int index;
  
  if (*field != 0) {
    uVar6 = md->tag;
    pbVar3 = output->ptr;
    if (uVar6 < 0x80) {
      *pbVar3 = (byte)uVar6;
      pbVar3 = pbVar3 + 1;
    }
    else {
      *pbVar3 = (byte)uVar6 | 0x80;
      if (uVar6 < 0x4000) {
        pbVar3[1] = (byte)(uVar6 >> 7);
        pbVar3 = pbVar3 + 2;
      }
      else {
        pbVar3 = pbVar3 + 2;
        uVar6 = uVar6 >> 7;
        do {
          pbVar4 = pbVar3;
          pbVar4[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          pbVar3 = pbVar4 + 1;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
        *pbVar4 = (byte)uVar7;
      }
    }
    uVar6 = *(uint *)((long)field + 0x10);
    if (uVar6 < 0x80) {
      *pbVar3 = (byte)uVar6;
      pbVar3 = pbVar3 + 1;
    }
    else {
      *pbVar3 = (byte)uVar6 | 0x80;
      if (uVar6 < 0x4000) {
        pbVar3[1] = (byte)(uVar6 >> 7);
        pbVar3 = pbVar3 + 2;
      }
      else {
        pbVar3 = pbVar3 + 2;
        uVar6 = uVar6 >> 7;
        do {
          pbVar4 = pbVar3;
          pbVar4[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          pbVar3 = pbVar4 + 1;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar2);
        *pbVar4 = (byte)uVar7;
      }
    }
    output->ptr = pbVar3;
    if (0 < *field) {
      index = 0;
      do {
        puVar5 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
        puVar1 = (uint *)output->ptr;
        *puVar1 = *puVar5;
        output->ptr = (uint8 *)(puVar1 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}